

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O0

void __thiscall chrono::ChVector<double>::ArchiveIN(ChVector<double> *this,ChArchiveIn *marchive)

{
  ChArchiveIn *pCVar1;
  ChNameValue<double> local_70;
  ChNameValue<double> local_58;
  ChNameValue<double> local_30;
  ChArchiveIn *local_18;
  ChArchiveIn *marchive_local;
  ChVector<double> *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveIn *)this;
  ChArchiveIn::VersionRead<chrono::ChVector<double>>(marchive);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_30,"m_data[0]",this->m_data,"x",'\0');
  ChArchiveIn::operator>>(pCVar1,&local_30);
  ChNameValue<double>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_58,"m_data[1]",this->m_data + 1,"y",'\0');
  ChArchiveIn::operator>>(pCVar1,&local_58);
  ChNameValue<double>::~ChNameValue(&local_58);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_70,"m_data[2]",this->m_data + 2,"z",'\0');
  ChArchiveIn::operator>>(pCVar1,&local_70);
  ChNameValue<double>::~ChNameValue(&local_70);
  return;
}

Assistant:

inline void ChVector<Real>::ArchiveIN(ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<ChVector<double>>();  // must use specialized template (any)
    // stream in all member m_data
    marchive >> CHNVP(m_data[0], "x");
    marchive >> CHNVP(m_data[1], "y");
    marchive >> CHNVP(m_data[2], "z");
}